

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_lib.c
# Opt level: O0

int EC_POINT_cmp(EC_GROUP *group,EC_POINT *a,EC_POINT *b,BN_CTX *ctx)

{
  undefined4 local_4;
  
  if (*(long *)(*(long *)group + 0xd8) == 0) {
    local_4 = -1;
  }
  else if ((*(long *)group == *(long *)a) && (*(long *)a == *(long *)b)) {
    local_4 = (**(code **)(*(long *)group + 0xd8))(group,a,b,ctx);
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int EC_POINT_cmp(const EC_GROUP *group, const EC_POINT *a, const EC_POINT *b,
                 BN_CTX *ctx)
{
    if (group->meth->point_cmp == 0) {
        //ECerr(EC_F_EC_POINT_CMP, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
        return -1;
    }
    if ((group->meth != a->meth) || (a->meth != b->meth)) {
        //ECerr(EC_F_EC_POINT_CMP, EC_R_INCOMPATIBLE_OBJECTS);
        return -1;
    }
    return group->meth->point_cmp(group, a, b, ctx);
}